

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O1

void qpdf_set_r3_encryption_parameters_insecure
               (qpdf_data qpdf,char *user_password,char *owner_password,
               QPDF_BOOL allow_accessibility,QPDF_BOOL allow_extract,QPDF_BOOL allow_assemble,
               QPDF_BOOL allow_annotate_and_form,QPDF_BOOL allow_form_filling,
               QPDF_BOOL allow_modify_other,qpdf_r3_print_e print)

{
  QPDFWriter::setR3EncryptionParametersInsecure
            ((qpdf->qpdf_writer).super___shared_ptr<QPDFWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             user_password,owner_password,allow_accessibility != 0,allow_extract != 0,
             allow_assemble != 0,allow_annotate_and_form != 0,allow_form_filling != 0,
             allow_modify_other != 0,print);
  return;
}

Assistant:

void
qpdf_set_r3_encryption_parameters_insecure(
    qpdf_data qpdf,
    char const* user_password,
    char const* owner_password,
    QPDF_BOOL allow_accessibility,
    QPDF_BOOL allow_extract,
    QPDF_BOOL allow_assemble,
    QPDF_BOOL allow_annotate_and_form,
    QPDF_BOOL allow_form_filling,
    QPDF_BOOL allow_modify_other,
    enum qpdf_r3_print_e print)
{
    QTC::TC("qpdf", "qpdf-c called qpdf_set_r3_encryption_parameters_insecure");
    qpdf->qpdf_writer->setR3EncryptionParametersInsecure(
        user_password,
        owner_password,
        allow_accessibility != QPDF_FALSE,
        allow_extract != QPDF_FALSE,
        allow_assemble != QPDF_FALSE,
        allow_annotate_and_form != QPDF_FALSE,
        allow_form_filling != QPDF_FALSE,
        allow_modify_other != QPDF_FALSE,
        print);
}